

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O0

int lws_tls_fake_POLLIN_for_buffered(lws_context_per_thread *pt)

{
  ushort uVar1;
  lws_dll2 *plVar2;
  lws *wsi;
  lws_dll2 *p1;
  lws_dll2 *p;
  int ret;
  lws_context_per_thread *pt_local;
  
  uVar1 = 0;
  plVar2 = lws_dll2_get_head(&(pt->tls).dll_pending_tls_owner);
  while (p1 = plVar2, p1 != (lws_dll2 *)0x0) {
    plVar2 = p1->next;
    if (-1 < *(int *)((long)&p1[4].prev + 4)) {
      pt->fds[*(int *)((long)&p1[4].prev + 4)].revents =
           pt->fds[*(int *)((long)&p1[4].prev + 4)].revents |
           pt->fds[*(int *)((long)&p1[4].prev + 4)].events & 1U;
      uVar1 = pt->fds[*(int *)((long)&p1[4].prev + 4)].revents & 1U | uVar1;
    }
  }
  return (int)(uVar1 != 0);
}

Assistant:

int
lws_tls_fake_POLLIN_for_buffered(struct lws_context_per_thread *pt)
{
	int ret = 0;

	lws_start_foreach_dll_safe(struct lws_dll2 *, p, p1,
			lws_dll2_get_head(&pt->tls.dll_pending_tls_owner)) {
		struct lws *wsi = lws_container_of(p, struct lws,
						   tls.dll_pending_tls);

		if (wsi->position_in_fds_table >= 0) {

			pt->fds[wsi->position_in_fds_table].revents = (short)
				(pt->fds[wsi->position_in_fds_table].revents |
				 (pt->fds[wsi->position_in_fds_table].events & LWS_POLLIN));
			ret |= pt->fds[wsi->position_in_fds_table].revents & LWS_POLLIN;
		}

	} lws_end_foreach_dll_safe(p, p1);

	return !!ret;
}